

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O3

int bdelete(bstring b,int pos,int len)

{
  ulong uVar1;
  uint uVar2;
  uint uVar4;
  uint uVar5;
  uchar *puVar6;
  uint uVar7;
  uint uVar3;
  int iVar8;
  
  uVar1 = 0;
  if (0 < pos) {
    uVar1 = (ulong)(uint)pos;
  }
  uVar2 = (uint)uVar1;
  iVar8 = 0;
  if (pos < 0) {
    iVar8 = pos;
  }
  uVar7 = iVar8 + len;
  iVar8 = -1;
  if ((((b != (bstring)0x0 && -1 < (int)uVar7) && (puVar6 = b->data, puVar6 != (uchar *)0x0)) &&
      (uVar3 = b->slen, -1 < (int)uVar3)) && (0 < b->mlen && (int)uVar3 <= b->mlen)) {
    iVar8 = 0;
    if (uVar2 < uVar3 && uVar7 != 0) {
      uVar5 = uVar7 + uVar2;
      uVar4 = uVar3 - uVar5;
      if (uVar5 <= uVar3 && uVar4 != 0) {
        if (uVar4 != 0 && (int)uVar5 <= (int)uVar3) {
          memmove(puVar6 + uVar1,puVar6 + uVar1 + uVar7,(ulong)uVar4);
          uVar3 = b->slen;
          puVar6 = b->data;
        }
        uVar2 = uVar3 - uVar7;
      }
      b->slen = uVar2;
      puVar6[(int)uVar2] = '\0';
      iVar8 = 0;
    }
  }
  return iVar8;
}

Assistant:

int bdelete (bstring b, int pos, int len) {
	/* Clamp to left side of bstring */
	if (pos < 0) {
		len += pos;
		pos = 0;
	}

	if (len < 0 || b == NULL || b->data == NULL || b->slen < 0 || 
	    b->mlen < b->slen || b->mlen <= 0) 
		return BSTR_ERR;
	if (len > 0 && pos < b->slen) {
		if (pos + len >= b->slen) {
			b->slen = pos;
		} else {
			bBlockCopy ((char *) (b->data + pos),
			            (char *) (b->data + pos + len), 
			            b->slen - (pos+len));
			b->slen -= len;
		}
		b->data[b->slen] = (unsigned char) '\0';
	}
	return BSTR_OK;
}